

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void assignment(LexState *ls,LHS_assign *lh,int nvars)

{
  expdesc *var;
  byte bVar1;
  bool bVar2;
  int iVar3;
  FuncState *pFVar4;
  expdesc e;
  
  if (2 < (lh->v).k - VLOCAL) {
    luaX_syntaxerror(ls,"syntax error");
  }
  var = &lh->v;
  iVar3 = testnext(ls,0x2c);
  if (iVar3 == 0) {
    checknext(ls,0x3d);
    iVar3 = explist(ls,&e);
    if (iVar3 == nvars) {
      luaK_setoneret(ls->fs,&e);
      pFVar4 = ls->fs;
      goto LAB_001199eb;
    }
    adjust_assign(ls,nvars,iVar3,&e);
  }
  else {
    e._0_8_ = lh;
    suffixedexp(ls,(expdesc *)&e.u.ind);
    if (e.u.info != 10) {
      pFVar4 = ls->fs;
      bVar1 = pFVar4->freereg;
      bVar2 = false;
      for (; lh != (LHS_assign *)0x0; lh = lh->prev) {
        if ((lh->v).k == VINDEXED) {
          if ((e.u.info == (uint)(lh->v).u.ind.vt) && (e.t == (uint)(lh->v).u.ind.t)) {
            (lh->v).u.ind.vt = '\b';
            (lh->v).u.ind.t = bVar1;
            bVar2 = true;
          }
          if ((e.u.info == 8) && (e.t == (lh->v).u.ind.idx)) {
            *(ushort *)&(lh->v).u = (ushort)bVar1;
            bVar2 = true;
          }
        }
      }
      if (bVar2) {
        luaK_codeABC(pFVar4,(uint)(e.u.info != 8) * 5,(uint)bVar1,e.t,0);
        luaK_reserveregs(pFVar4,1);
      }
    }
    checklimit(ls->fs,(uint)ls->L->nCcalls + nvars,200,"C levels");
    assignment(ls,(LHS_assign *)&e,nvars + 1);
  }
  pFVar4 = ls->fs;
  e.t = -1;
  e.f = -1;
  e.u.info = pFVar4->freereg - 1;
  e.k = VNONRELOC;
LAB_001199eb:
  luaK_storevar(pFVar4,var,&e);
  return;
}

Assistant:

static void assignment (LexState *ls, struct LHS_assign *lh, int nvars) {
  expdesc e;
  check_condition(ls, vkisvar(lh->v.k), "syntax error");
  if (testnext(ls, ',')) {  /* assignment -> ',' suffixedexp assignment */
    struct LHS_assign nv;
    nv.prev = lh;
    suffixedexp(ls, &nv.v);
    if (nv.v.k != VINDEXED)
      check_conflict(ls, lh, &nv.v);
    checklimit(ls->fs, nvars + ls->L->nCcalls, LUAI_MAXCCALLS,
                    "C levels");
    assignment(ls, &nv, nvars+1);
  }
  else {  /* assignment -> '=' explist */
    int nexps;
    checknext(ls, '=');
    nexps = explist(ls, &e);
    if (nexps != nvars)
      adjust_assign(ls, nvars, nexps, &e);
    else {
      luaK_setoneret(ls->fs, &e);  /* close last expression */
      luaK_storevar(ls->fs, &lh->v, &e);
      return;  /* avoid default */
    }
  }
  init_exp(&e, VNONRELOC, ls->fs->freereg-1);  /* default assignment */
  luaK_storevar(ls->fs, &lh->v, &e);
}